

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,VaryingLocationAliasingWithMixedTypesTest *this,
          GLuint test_case_index)

{
  reference pvVar1;
  ostream *poVar2;
  GLchar *pGVar3;
  testCase *test_case;
  stringstream stream;
  ostream local_198;
  uint local_1c;
  VaryingLocationAliasingWithMixedTypesTest *pVStack_18;
  GLuint test_case_index_local;
  VaryingLocationAliasingWithMixedTypesTest *this_local;
  
  local_1c = test_case_index;
  pVStack_18 = this;
  this_local = (VaryingLocationAliasingWithMixedTypesTest *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&test_case);
  pvVar1 = std::
           vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedTypesTest::testCase>_>
           ::operator[](&this->m_test_cases,(ulong)local_1c);
  poVar2 = std::operator<<(&local_198,"Stage: ");
  pGVar3 = Utils::Shader::GetStageName(pvVar1->m_stage);
  poVar2 = std::operator<<(poVar2,pGVar3);
  poVar2 = std::operator<<(poVar2,", ");
  pGVar3 = Utils::Type::GetGLSLTypeName(&pvVar1->m_type_gohan);
  poVar2 = std::operator<<(poVar2,pGVar3);
  poVar2 = std::operator<<(poVar2," at ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar1->m_component_gohan);
  poVar2 = std::operator<<(poVar2,", ");
  pGVar3 = Utils::Type::GetGLSLTypeName(&pvVar1->m_type_goten);
  poVar2 = std::operator<<(poVar2,pGVar3);
  poVar2 = std::operator<<(poVar2," at ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pvVar1->m_component_goten);
  std::operator<<(poVar2,". Direction: ");
  if ((pvVar1->m_is_input & 1U) == 1) {
    std::operator<<(&local_198,"input");
  }
  else {
    std::operator<<(&local_198,"output");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&test_case);
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingLocationAliasingWithMixedTypesTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage) << ", "
		   << test_case.m_type_gohan.GetGLSLTypeName() << " at " << test_case.m_component_gohan << ", "
		   << test_case.m_type_goten.GetGLSLTypeName() << " at " << test_case.m_component_goten << ". Direction: ";

	if (true == test_case.m_is_input)
	{
		stream << "input";
	}
	else
	{
		stream << "output";
	}

	return stream.str();
}